

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O2

ON__LayerExtensions *
ON__LayerExtensions::LayerExtensions(ON_Layer *layer,uchar *layer_m_extension_bits,bool bCreate)

{
  byte bVar1;
  ON_UserData *p;
  ON__LayerExtensions *this;
  ON_UUID local_30;
  
  local_30 = ON_ClassId::Uuid(&m_ON__LayerExtensions_class_rtti);
  p = ON_Object::GetUserData((ON_Object *)layer,&local_30);
  this = Cast(&p->super_ON_Object);
  if (this == (ON__LayerExtensions *)0x0) {
    if (!bCreate) {
      bVar1 = *layer_m_extension_bits | 1;
      this = (ON__LayerExtensions *)0x0;
      goto LAB_004db9d7;
    }
    this = (ON__LayerExtensions *)operator_new(0xe0);
    ON__LayerExtensions(this);
    ON_Object::AttachUserData((ON_Object *)layer,(ON_UserData *)this);
  }
  bVar1 = *layer_m_extension_bits & 0xfe;
LAB_004db9d7:
  *layer_m_extension_bits = bVar1;
  return this;
}

Assistant:

ON__LayerExtensions* ON__LayerExtensions::LayerExtensions(const ON_Layer& layer, const unsigned char* layer_m_extension_bits, bool bCreate)
{
  ON__LayerExtensions* ud = ON__LayerExtensions::Cast(layer.GetUserData(ON_CLASS_ID(ON__LayerExtensions)));

  if ( 0 == ud )
  {
    if ( bCreate )
    {
      ud = new ON__LayerExtensions();
      const_cast<ON_Layer&>(layer).AttachUserData(ud);
      // Clear 0x01 bit of ON_Layer::m_extension_bits so 
      // ON_Layer visibility and color queries will check
      // for ON__LayerExtensions userdata.
      ClearExtensionBit( const_cast<unsigned char*>(layer_m_extension_bits), 0x01 );
    }
    else
    {
      // Set 0x01 bit of ON_Layer::m_extension_bits so 
      // ON_Layer visibility and color queries will not
      // perform the expensive check for ON__LayerExtensions 
      // userdata. This speeds up visibility and color queries 
      // that occur millions of times when complicated models
      // are rendered.
      SetExtensionBit( const_cast<unsigned char*>(layer_m_extension_bits), 0x01 );
    }
  }
  else
  {
    // Clear 0x01 bit of ON_Layer::m_extension_bits so 
    // ON_Layer visibility and color queries will check
    // for ON__LayerExtensions userdata.
    ClearExtensionBit( const_cast<unsigned char*>(layer_m_extension_bits), 0x01 );
  }

  return ud;
}